

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

bool __thiscall Debugger::DoHitCondition(Debugger *this,shared_ptr<BreakPoint> *bp)

{
  char cVar1;
  int iVar2;
  element_type *peVar3;
  long lVar4;
  char *pcVar5;
  long lStack_40;
  char ch;
  size_t index;
  unsigned_long_long hitTimes;
  Operator evalOperator;
  ParseState state;
  string *hitCondition;
  shared_ptr<BreakPoint> *bp_local;
  Debugger *this_local;
  
  peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      bp);
  hitTimes._4_4_ = 0;
  hitTimes._0_4_ = 4;
  index = 0;
  lStack_40 = 0;
  do {
    lVar4 = std::__cxx11::string::size();
    if (lStack_40 == lVar4) {
      switch((undefined4)hitTimes) {
      case 0:
        peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)bp);
        this_local._7_1_ = index < (ulong)(long)peVar3->hitCount;
        break;
      case 1:
        peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)bp);
        this_local._7_1_ = (ulong)(long)peVar3->hitCount < index;
        break;
      case 2:
        peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)bp);
        this_local._7_1_ = (ulong)(long)peVar3->hitCount <= index;
        break;
      case 3:
        peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)bp);
        this_local._7_1_ = index <= (ulong)(long)peVar3->hitCount;
        break;
      case 4:
        peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)bp);
        this_local._7_1_ = (long)peVar3->hitCount == index;
        break;
      default:
        this_local._7_1_ = false;
      }
      return this_local._7_1_;
    }
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&peVar3->hitCondition);
    cVar1 = *pcVar5;
    switch(hitTimes._4_4_) {
    case 0:
      if (cVar1 != ' ') {
        if (cVar1 == '=') {
          hitTimes._4_4_ = 3;
        }
        else if (cVar1 == '<') {
          hitTimes._4_4_ = 2;
        }
        else {
          if (cVar1 != '>') {
            return false;
          }
          hitTimes._4_4_ = 1;
        }
      }
      break;
    case 1:
      if (cVar1 == '=') {
        hitTimes._0_4_ = 3;
        hitTimes._4_4_ = 4;
      }
      else {
        iVar2 = isdigit((int)cVar1);
        if (iVar2 == 0) {
          if (cVar1 != ' ') {
            return false;
          }
          hitTimes._4_4_ = 4;
        }
        else {
          index = (size_t)(cVar1 + -0x30);
          hitTimes._4_4_ = 5;
        }
        hitTimes._0_4_ = 0;
      }
      break;
    case 2:
      if (cVar1 == '=') {
        hitTimes._0_4_ = 2;
        hitTimes._4_4_ = 4;
      }
      else {
        iVar2 = isdigit((int)cVar1);
        if (iVar2 == 0) {
          if (cVar1 != ' ') {
            return false;
          }
          hitTimes._0_4_ = 0;
          hitTimes._4_4_ = 4;
        }
        else {
          hitTimes._0_4_ = 1;
          index = (size_t)(cVar1 + -0x30);
          hitTimes._4_4_ = 5;
        }
      }
      break;
    case 3:
      if (cVar1 != '=') {
        return false;
      }
      hitTimes._0_4_ = 4;
      hitTimes._4_4_ = 4;
      break;
    case 4:
      if (cVar1 != ' ') {
        iVar2 = isdigit((int)cVar1);
        if (iVar2 == 0) {
          return false;
        }
        index = (size_t)(cVar1 + -0x30);
        hitTimes._4_4_ = 5;
      }
      break;
    case 5:
      iVar2 = isdigit((int)cVar1);
      if (iVar2 == 0) {
        if (cVar1 != ' ') {
          return false;
        }
        hitTimes._4_4_ = 6;
      }
      else {
        index = index * 10 + (long)(cVar1 + -0x30);
      }
      break;
    case 6:
      if (cVar1 != ' ') {
        return false;
      }
    }
    lStack_40 = lStack_40 + 1;
  } while( true );
}

Assistant:

bool Debugger::DoHitCondition(std::shared_ptr<BreakPoint> bp) {
	auto &hitCondition = bp->hitCondition;

	enum class ParseState {
		ExpectedOperator,
		// 大于
		Gt,
		// 小于
		Le,
		// 单等号 
		Eq,

		ExpectedHitTimes,

		ParseDigit,

		ParseFinish
	} state = ParseState::ExpectedOperator;

	enum class Operator {
		// 大于
		Gt,
		// 小于
		Le,
		// 小于等于
		LeEq,
		// 大于等于
		GtEq,
		// 双等号
		EqEq,
	} evalOperator = Operator::EqEq;

	unsigned long long hitTimes = 0;

	for (std::size_t index = 0; index != hitCondition.size(); index++) {
		char ch = hitCondition[index];

		switch (state) {
			case ParseState::ExpectedOperator: {
				if (ch == ' ') {
					continue;
				}

				if (ch == '=') {
					state = ParseState::Eq;
				} else if (ch == '<') {
					state = ParseState::Le;
				} else if (ch == '>') {
					state = ParseState::Gt;
				} else {
					return false;
				}

				break;
			}
			case ParseState::Eq: {
				if (ch == '=') {
					evalOperator = Operator::EqEq;
					state = ParseState::ExpectedHitTimes;
				} else {
					return false;
				}
				break;
			}
			case ParseState::Gt: {
				if (ch == '=') {
					evalOperator = Operator::GtEq;
					state = ParseState::ExpectedHitTimes;
				} else if (isdigit(ch)) {
					evalOperator = Operator::Gt;
					hitTimes = ch - '0';
					state = ParseState::ParseDigit;
				} else if (ch == ' ') {
					evalOperator = Operator::Gt;
					state = ParseState::ExpectedHitTimes;
				} else {
					return false;
				}
				break;
			}
			case ParseState::Le: {
				if (ch == '=') {
					evalOperator = Operator::LeEq;
					state = ParseState::ExpectedHitTimes;
				} else if (isdigit(ch)) {
					evalOperator = Operator::Le;
					hitTimes = ch - '0';
					state = ParseState::ParseDigit;
				} else if (ch == ' ') {
					evalOperator = Operator::Gt;
					state = ParseState::ExpectedHitTimes;
				} else {
					return false;
				}
				break;
			}
			case ParseState::ExpectedHitTimes: {
				if (ch == ' ') {
					continue;
				} else if (isdigit(ch)) {
					hitTimes = ch - '0';
					state = ParseState::ParseDigit;
				} else {
					return false;
				}
				break;
			}
			case ParseState::ParseDigit: {
				if (isdigit(ch)) {
					hitTimes = hitTimes * 10 + (ch - '0');
				} else if (ch == ' ') {
					state = ParseState::ParseFinish;
				} else {
					return false;
				}

				break;
			}
			case ParseState::ParseFinish: {
				if (ch == ' ') {
					break;
				} else {
					return false;
				}
				break;
			}
		}
	}

	switch (evalOperator) {
		case Operator::EqEq: {
			return bp->hitCount == hitTimes;
		}
		case Operator::Gt: {
			return bp->hitCount > hitTimes;
		}
		case Operator::GtEq: {
			return bp->hitCount >= hitTimes;
		}
		case Operator::Le: {
			return bp->hitCount < hitTimes;
		}
		case Operator::LeEq: {
			return bp->hitCount <= hitTimes;
		}
	}


	return false;
}